

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# configuration.cc
# Opt level: O0

fdb_config * get_default_config(void)

{
  bool bVar1;
  size_t sVar2;
  fdb_config *in_RDI;
  ssize_t num_cores;
  int i;
  int local_4;
  
  in_RDI->chunksize = 8;
  in_RDI->blocksize = 0x1000;
  in_RDI->buffercache_size = 0x8000000;
  in_RDI->wal_threshold = 0x1000;
  in_RDI->wal_flush_before_commit = true;
  in_RDI->auto_commit = false;
  in_RDI->purging_interval = 0;
  in_RDI->seqtree_opt = '\0';
  in_RDI->durability_opt = '\0';
  in_RDI->flags = 1;
  in_RDI->compaction_buf_maxsize = 0x4000000;
  in_RDI->cleanup_cache_onclose = true;
  in_RDI->compress_document_body = false;
  in_RDI->compaction_mode = '\0';
  in_RDI->compaction_threshold = '\x1e';
  in_RDI->compaction_minimum_filesize = 0x100000;
  in_RDI->compactor_sleep_duration = 0x7080;
  in_RDI->multi_kv_instances = true;
  in_RDI->prefetch_duration = 0;
  local_4 = 0;
  sVar2 = get_num_cores();
  while( true ) {
    bVar1 = false;
    if (0 < prime_size_table[local_4]) {
      bVar1 = prime_size_table[local_4] < (long)sVar2;
    }
    if (!bVar1) break;
    local_4 = local_4 + 1;
  }
  if (prime_size_table[local_4] == -1) {
    in_RDI->num_wal_partitions = (uint16_t)prime_size_table[local_4 + -1];
    in_RDI->num_bcache_partitions = (uint16_t)prime_size_table[local_4 + -1];
  }
  else {
    in_RDI->num_wal_partitions = (uint16_t)prime_size_table[local_4];
    in_RDI->num_bcache_partitions = (uint16_t)prime_size_table[local_4];
  }
  in_RDI->compaction_cb = (fdb_compaction_callback)0x0;
  in_RDI->compaction_cb_mask = 0;
  in_RDI->compaction_cb_ctx = (void *)0x0;
  in_RDI->max_writer_lock_prob = 100;
  in_RDI->num_compactor_threads = 4;
  in_RDI->enable_background_compactor = true;
  in_RDI->num_bgflusher_threads = 2;
  in_RDI->block_reusing_threshold = 0x41;
  in_RDI->min_block_reuse_filesize = 0x1000000;
  in_RDI->max_block_reusing_cycle = 0;
  in_RDI->num_keeping_headers = 5;
  (in_RDI->encryption_key).algorithm = 0;
  memset((in_RDI->encryption_key).bytes,0,0x20);
  in_RDI->breakpad_minidump_dir = ".";
  in_RDI->log_msg_level = 1;
  in_RDI->do_not_move_to_compacted_file = false;
  in_RDI->enable_reusable_block_reservation = false;
  in_RDI->bulk_load_mode = false;
  in_RDI->do_not_search_wal = false;
  in_RDI->do_not_cache_doc_blocks = false;
  in_RDI->num_blocks_readahead = 0;
  in_RDI->bottom_up_index_build = false;
  return in_RDI;
}

Assistant:

fdb_config get_default_config(void) {
    fdb_config fconfig;

    fconfig.chunksize = sizeof(uint64_t);
    // 4KB by default.
    fconfig.blocksize = FDB_BLOCKSIZE;
    // 128MB by default.
    fconfig.buffercache_size = 134217728;
    // 4K WAL entries by default.
    fconfig.wal_threshold = 4096;
    fconfig.wal_flush_before_commit = true;
    fconfig.auto_commit = false;
    // 0 second by default.
    fconfig.purging_interval = 0;
    // Sequnce trees are disabled by default.
    fconfig.seqtree_opt = FDB_SEQTREE_NOT_USE;
    // Use a synchronous commit by default.
    fconfig.durability_opt = FDB_DRB_NONE;
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    // 4MB by default.
    fconfig.compaction_buf_maxsize = FDB_COMP_BUF_MINSIZE;
    // Clean up cache entries when a file is closed.
    fconfig.cleanup_cache_onclose = true;
    // Compress the body of documents using snappy. Disabled by default.
    fconfig.compress_document_body = false;
    // Auto compaction is disabled by default
    fconfig.compaction_mode = FDB_COMPACTION_MANUAL;
    // Compaction threshold, 30% by default
    fconfig.compaction_threshold = FDB_DEFAULT_COMPACTION_THRESHOLD;
    fconfig.compaction_minimum_filesize = 1048576; // 1MB by default
    // 8 hours by default
    fconfig.compactor_sleep_duration = FDB_COMPACTOR_SLEEP_DURATION;
    // Multi KV Instance mode is enabled by default
    fconfig.multi_kv_instances = true;
    // TODO: Re-enable this after prefetch ThreadSanitizer fixes are in..
    fconfig.prefetch_duration = 0;

    // Determine the number of WAL and buffer cache partitions by considering the
    // number of cores available in the host environment.
    int i = 0;
    ssize_t num_cores = (ssize_t) get_num_cores();
    for (; prime_size_table[i] > 0 && prime_size_table[i] < num_cores; ++i) {
        // Finding the smallest prime number that is greater than the number of cores.
    }
    if (prime_size_table[i] == -1) {
        fconfig.num_wal_partitions = prime_size_table[i-1];
        fconfig.num_bcache_partitions = prime_size_table[i-1];
    } else {
        fconfig.num_wal_partitions = prime_size_table[i];
        // For bcache partitions pick a higher value for smaller avl trees
        fconfig.num_bcache_partitions = prime_size_table[i];
    }

    // No compaction callback function by default
    fconfig.compaction_cb = NULL;
    fconfig.compaction_cb_mask = 0x0;
    fconfig.compaction_cb_ctx = NULL;
    fconfig.max_writer_lock_prob = 100;
    // 4 daemon compactor threads by default
    fconfig.num_compactor_threads = DEFAULT_NUM_COMPACTOR_THREADS;
    fconfig.enable_background_compactor = true;
    fconfig.num_bgflusher_threads = DEFAULT_NUM_BGFLUSHER_THREADS;
    // Block reusing threshold, 65% by default (i.e., almost 3x space amplification)
    fconfig.block_reusing_threshold = 65;
    // Trigger block reuse after 16MB.
    fconfig.min_block_reuse_filesize = SB_MIN_BLOCK_REUSING_FILESIZE;
    // Unlimited cycle.
    fconfig.max_block_reusing_cycle = 0;
    // Keep at most 5 recent committed database snapshots
    fconfig.num_keeping_headers = 5;

    fconfig.encryption_key.algorithm = FDB_ENCRYPTION_NONE;
    memset(fconfig.encryption_key.bytes, 0, sizeof(fconfig.encryption_key.bytes));

    // Breakpad minidump directory, set to current working dir
    fconfig.breakpad_minidump_dir = ".";

    // Default log level: FATAL (1)
    fconfig.log_msg_level = 1;

    // Auto move to new file.
    fconfig.do_not_move_to_compacted_file = false;

    // Disable reserved blocks.
    fconfig.enable_reusable_block_reservation = false;

    // Disable bulk load mode.
    fconfig.bulk_load_mode = false;

    // WAL data should be visiable by default.
    fconfig.do_not_search_wal = false;

    // Document blocks are cached by default.
    fconfig.do_not_cache_doc_blocks = false;

    // Disable read-ahead by default.
    fconfig.num_blocks_readahead = 0;

    // Disable bottom-up build by default.
    fconfig.bottom_up_index_build = false;

    return fconfig;
}